

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O2

RTMatrix4x4 * __thiscall
RTMatrix4x4::inverted(RTMatrix4x4 *__return_storage_ptr__,RTMatrix4x4 *this)

{
  int row_00;
  int col_00;
  RTFLOAT (*paRVar1) [4];
  int col;
  long lVar2;
  RTFLOAT (*paRVar3) [4];
  int row;
  long lVar4;
  RTFLOAT RVar5;
  float fVar6;
  RTFLOAT RVar7;
  
  RTMatrix4x4(__return_storage_ptr__);
  RVar5 = matDet(this);
  if ((RVar5 != 0.0) || (NAN(RVar5))) {
    paRVar3 = (RTFLOAT (*) [4])__return_storage_ptr__;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      paRVar1 = paRVar3;
      for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
        row_00 = (int)lVar4;
        col_00 = (int)lVar2;
        if ((row_00 + col_00 & 1U) == 0) {
          fVar6 = matMinor(this,row_00,col_00);
        }
        else {
          RVar7 = matMinor(this,row_00,col_00);
          fVar6 = -RVar7;
        }
        (*(RTFLOAT (*) [4])*paRVar1)[0] = fVar6 / RVar5;
        paRVar1 = paRVar1 + 1;
      }
      paRVar3 = (RTFLOAT (*) [4])(*paRVar3 + 1);
    }
  }
  else {
    setToIdentity(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

RTMatrix4x4 RTMatrix4x4::inverted()
{
    RTMatrix4x4 res;

    RTFLOAT det = matDet();

    if (det == 0) {
        res.setToIdentity();
        return res;
    }

    for (int row = 0; row < 4; row++) {
        for (int col = 0; col < 4; col++) {
            if ((row + col) & 1)
                res.m_data[col][row] = -matMinor(row, col) / det;
            else
                res.m_data[col][row] = matMinor(row, col) / det;
        }
    }

    return res;
}